

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackend::~CudaBackend(CudaBackend *this)

{
  CudaBackendPrivate *this_00;
  int __fd;
  CudaBackendPrivate *in_RDI;
  CudaBackendPrivate *pCVar1;
  
  in_RDI->controller = (Controller *)&PTR__CudaBackend_002b83b8;
  this_00 = (CudaBackendPrivate *)(in_RDI->status).m_errors;
  pCVar1 = in_RDI;
  if (this_00 != (CudaBackendPrivate *)0x0) {
    pCVar1 = this_00;
    CudaBackendPrivate::~CudaBackendPrivate(this_00);
    operator_delete(pCVar1);
  }
  __fd = (int)pCVar1;
  CudaLib::close(__fd);
  NvmlLib::close(__fd);
  IBackend::~IBackend((IBackend *)in_RDI);
  return;
}

Assistant:

xmrig::CudaBackend::~CudaBackend()
{
    delete d_ptr;

    CudaLib::close();

#   ifdef XMRIG_FEATURE_NVML
    NvmlLib::close();
#   endif
}